

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

void __thiscall testing::internal::UnitTestImpl::UnshuffleTests(UnitTestImpl *this)

{
  pointer ppTVar1;
  pointer piVar2;
  TestSuite *pTVar3;
  long lVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  
  auVar6 = _DAT_00174c60;
  auVar5 = _DAT_00174c50;
  ppTVar1 = (this->test_suites_).
            super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  lVar7 = (long)(this->test_suites_).
                super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)ppTVar1;
  if (lVar7 != 0) {
    lVar7 = lVar7 >> 3;
    piVar2 = (this->test_suite_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar8 = 0;
    do {
      pTVar3 = ppTVar1[lVar8];
      lVar4 = *(long *)&(pTVar3->test_indices_).super__Vector_base<int,_std::allocator<int>_>.
                        _M_impl.super__Vector_impl_data;
      lVar9 = (long)*(pointer *)
                     ((long)&(pTVar3->test_indices_).super__Vector_base<int,_std::allocator<int>_>.
                             _M_impl + 8) - lVar4;
      if (lVar9 != 0) {
        lVar9 = lVar9 >> 2;
        lVar9 = lVar9 + (ulong)(lVar9 == 0);
        lVar10 = lVar9 + -1;
        auVar12._8_4_ = (int)lVar10;
        auVar12._0_8_ = lVar10;
        auVar12._12_4_ = (int)((ulong)lVar10 >> 0x20);
        auVar12 = auVar12 ^ auVar6;
        uVar11 = 0;
        auVar13 = auVar5;
        do {
          auVar14 = auVar13 ^ auVar6;
          if ((bool)(~(auVar12._4_4_ < auVar14._4_4_ ||
                      auVar12._0_4_ < auVar14._0_4_ && auVar14._4_4_ == auVar12._4_4_) & 1)) {
            *(int *)(lVar4 + uVar11 * 4) = (int)uVar11;
          }
          if (auVar14._12_4_ <= auVar12._12_4_ &&
              (auVar14._8_4_ <= auVar12._8_4_ || auVar14._12_4_ != auVar12._12_4_)) {
            *(int *)(lVar4 + 4 + uVar11 * 4) = (int)uVar11 + 1;
          }
          uVar11 = uVar11 + 2;
          lVar10 = auVar13._8_8_;
          auVar13._0_8_ = auVar13._0_8_ + 2;
          auVar13._8_8_ = lVar10 + 2;
        } while ((lVar9 + 1U & 0xfffffffffffffffe) != uVar11);
      }
      piVar2[lVar8] = (int)lVar8;
      lVar8 = lVar8 + 1;
    } while (lVar8 != lVar7 + (ulong)(lVar7 == 0));
  }
  return;
}

Assistant:

void UnitTestImpl::UnshuffleTests() {
  for (size_t i = 0; i < test_suites_.size(); i++) {
    // Unshuffles the tests in each test suite.
    test_suites_[i]->UnshuffleTests();
    // Resets the index of each test suite.
    test_suite_indices_[i] = static_cast<int>(i);
  }
}